

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

void aom_minmax_8x8_c(uint8_t *s,int p,uint8_t *d,int dp,int *min,int *max)

{
  int local_44;
  int local_40;
  int diff;
  int j;
  int i;
  int *max_local;
  int *min_local;
  int dp_local;
  uint8_t *d_local;
  int p_local;
  uint8_t *s_local;
  
  *min = 0xff;
  *max = 0;
  d_local = d;
  s_local = s;
  for (i = 0; i < 8; i = i + 1) {
    for (j = 0; j < 8; j = j + 1) {
      local_44 = (uint)s_local[j] - (uint)d_local[j];
      if (local_44 < 1) {
        local_44 = -local_44;
      }
      local_40 = local_44;
      if (*min <= local_44) {
        local_40 = *min;
      }
      *min = local_40;
      if (local_44 <= *max) {
        local_44 = *max;
      }
      *max = local_44;
    }
    s_local = s_local + p;
    d_local = d_local + dp;
  }
  return;
}

Assistant:

void aom_minmax_8x8_c(const uint8_t *s, int p, const uint8_t *d, int dp,
                      int *min, int *max) {
  int i, j;
  *min = 255;
  *max = 0;
  for (i = 0; i < 8; ++i, s += p, d += dp) {
    for (j = 0; j < 8; ++j) {
      int diff = abs(s[j] - d[j]);
      *min = diff < *min ? diff : *min;
      *max = diff > *max ? diff : *max;
    }
  }
}